

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O3

Instance * get_headless_instance(Instance *__return_storage_ptr__,uint32_t minor_version)

{
  void *pvVar1;
  InstanceBuilder *pIVar2;
  StringRef macroName;
  StringRef capturedExpression;
  Result<vkb::Instance> instance_ret;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_150;
  anon_union_56_2_293c120a_for_Result<vkb::Instance>_1 local_140;
  char local_108;
  undefined1 local_100 [64];
  IResultCapture *local_c0;
  pointer local_b8;
  pointer local_a8;
  pointer local_98;
  pointer local_78;
  pointer local_68;
  pointer local_60;
  pointer local_50;
  pointer local_48;
  pointer local_38;
  
  vkb::InstanceBuilder::InstanceBuilder((InstanceBuilder *)local_100);
  pIVar2 = vkb::InstanceBuilder::request_validation_layers((InstanceBuilder *)local_100,true);
  pIVar2 = vkb::InstanceBuilder::require_api_version(pIVar2,1,minor_version,0);
  pIVar2 = vkb::InstanceBuilder::set_headless(pIVar2,true);
  vkb::InstanceBuilder::build((Result<vkb::Instance> *)&local_140.m_value,pIVar2);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  pvVar1 = (void *)CONCAT44(local_100._60_4_,local_100._56_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_b8 - (long)pvVar1);
  }
  if ((pointer)local_100._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_100._32_8_,local_100._48_8_ - local_100._32_8_);
  }
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/tests/vulkan_mock_setup.cpp"
  ;
  local_150.line = 0xc;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x18;
  capturedExpression.m_start = "instance_ret.has_value()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_100,macroName,&local_150,capturedExpression,Normal);
  local_150.file = (char *)CONCAT71(local_150.file._1_7_,local_108);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_100,(ExprLhs<bool> *)&local_150);
  Catch::AssertionHandler::complete((AssertionHandler *)local_100);
  if (local_100[0x3b] == false) {
    (*local_c0->_vptr_IResultCapture[0x14])();
  }
  if (local_108 != '\0') {
    __return_storage_ptr__->headless = (bool)local_140._48_1_;
    __return_storage_ptr__->properties2_ext_enabled = local_140.m_value.properties2_ext_enabled;
    *(undefined6 *)&__return_storage_ptr__->field_0x32 = local_140._50_6_;
    __return_storage_ptr__->fp_vkGetDeviceProcAddr = local_140.m_value.fp_vkGetDeviceProcAddr;
    __return_storage_ptr__->instance_version = local_140._40_4_;
    __return_storage_ptr__->api_version = local_140.m_value.api_version;
    __return_storage_ptr__->allocation_callbacks = local_140.m_value.allocation_callbacks;
    __return_storage_ptr__->fp_vkGetInstanceProcAddr = local_140.m_value.fp_vkGetInstanceProcAddr;
    __return_storage_ptr__->instance = local_140.m_value.instance;
    __return_storage_ptr__->debug_messenger = local_140.m_value.debug_messenger;
    return __return_storage_ptr__;
  }
  __assert_fail("m_init",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                ,0x88,"T &vkb::Result<vkb::Instance>::value() & [T = vkb::Instance]");
}

Assistant:

vkb::Instance get_headless_instance(uint32_t minor_version) {
    auto instance_ret =
        vkb::InstanceBuilder().request_validation_layers().require_api_version(1, minor_version).set_headless().build();
    REQUIRE(instance_ret.has_value());
    return instance_ret.value();
}